

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_10::~ChElementTetraCorot_10
          (ChElementTetraCorot_10 *this,void **vtt)

{
  _func_int **pp_Var1;
  double *pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron = pp_Var1;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb34858;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb34918;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var1[-3] + -0x48 + (long)(&(this->super_ChElementCorotational).A + -1) + 0x40) =
       vtt[4];
  pdVar2 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
  ::~vector(&this->MatrB);
  this_00 = (this->Material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::~vector(&this->nodes);
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b339a8;
  ChKblockGeneric::~ChKblockGeneric(&(this->super_ChElementGeneric).Kmatr);
  return;
}

Assistant:

void ChElementTetraCorot_10::SetNodes(std::shared_ptr<ChNodeFEAxyz> nodeA,
                                      std::shared_ptr<ChNodeFEAxyz> nodeB,
                                      std::shared_ptr<ChNodeFEAxyz> nodeC,
                                      std::shared_ptr<ChNodeFEAxyz> nodeD,
                                      std::shared_ptr<ChNodeFEAxyz> nodeE,
                                      std::shared_ptr<ChNodeFEAxyz> nodeF,
                                      std::shared_ptr<ChNodeFEAxyz> nodeG,
                                      std::shared_ptr<ChNodeFEAxyz> nodeH,
                                      std::shared_ptr<ChNodeFEAxyz> nodeI,
                                      std::shared_ptr<ChNodeFEAxyz> nodeJ) {
    nodes[0] = nodeA;
    nodes[1] = nodeB;
    nodes[2] = nodeC;
    nodes[3] = nodeD;
    nodes[4] = nodeE;
    nodes[5] = nodeF;
    nodes[6] = nodeG;
    nodes[7] = nodeH;
    nodes[8] = nodeI;
    nodes[9] = nodeJ;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&nodes[0]->Variables());
    mvars.push_back(&nodes[1]->Variables());
    mvars.push_back(&nodes[2]->Variables());
    mvars.push_back(&nodes[3]->Variables());
    mvars.push_back(&nodes[4]->Variables());
    mvars.push_back(&nodes[5]->Variables());
    mvars.push_back(&nodes[6]->Variables());
    mvars.push_back(&nodes[7]->Variables());
    mvars.push_back(&nodes[8]->Variables());
    mvars.push_back(&nodes[9]->Variables());
    Kmatr.SetVariables(mvars);
}